

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_player_spells(void)

{
  char *message;
  ulong uVar1;
  wchar_t wVar2;
  ulong uVar3;
  long lVar4;
  uint16_t tmp16u;
  
  rd_u16b(&tmp16u);
  if ((player->class->magic).total_spells < (int)(uint)tmp16u) {
    message = format("Too many player spells (%d).");
    note(message);
    wVar2 = L'\xffffffff';
  }
  else {
    player_spells_init(player);
    for (uVar3 = 0; uVar1 = (ulong)tmp16u, uVar3 < uVar1; uVar3 = uVar3 + 1) {
      rd_byte(player->spell_flags + uVar3);
    }
    wVar2 = L'\0';
    for (lVar4 = 0; (uint)lVar4 < (uint)uVar1; lVar4 = lVar4 + 1) {
      rd_byte(player->spell_order + lVar4);
      uVar1 = (ulong)tmp16u;
    }
  }
  return wVar2;
}

Assistant:

int rd_player_spells(void)
{
	int i;
	uint16_t tmp16u;
	
	int cnt;
	
	/* Read the number of spells */
	rd_u16b(&tmp16u);
	if (tmp16u > player->class->magic.total_spells) {
		note(format("Too many player spells (%d).", tmp16u));
		return (-1);
	}

	/* Initialise */
	player_spells_init(player);
	
	/* Read the spell flags */
	for (i = 0; i < tmp16u; i++)
		rd_byte(&player->spell_flags[i]);
	
	/* Read the spell order */
	for (i = 0, cnt = 0; i < tmp16u; i++, cnt++)
		rd_byte(&player->spell_order[cnt]);
	
	/* Success */
	return (0);
}